

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

void __thiscall leveldb::DBImpl::ReleaseSnapshot(DBImpl *this,Snapshot *snapshot)

{
  std::mutex::lock(&(this->mutex_).mu_);
  SnapshotList::Delete(&this->snapshots_,(SnapshotImpl *)snapshot);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return;
}

Assistant:

void DBImpl::ReleaseSnapshot(const Snapshot* snapshot) {
  MutexLock l(&mutex_);
  snapshots_.Delete(static_cast<const SnapshotImpl*>(snapshot));
}